

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg_utils.hpp
# Opt level: O1

string * xdg_utils::data::home_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  string *in_RDI;
  string local_80;
  string local_60;
  string local_40;
  
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  env::get(in_RDI,(string *)XDG_DATA_HOME_abi_cxx11_,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((in_RDI->_M_string_length == 0) || (*(in_RDI->_M_dataplus)._M_p != '/')) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,&HOME,0x157844);
    env::get(&local_40,&local_60);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80.field_2._8_8_ = plVar2[3];
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_80._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (((char *)in_RDI->_M_string_length == (char *)0x0) || (*(in_RDI->_M_dataplus)._M_p != '/')) {
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)in_RDI->_M_string_length,0);
  }
  return in_RDI;
}

Assistant:

std::string home() {
  auto path = env::get(XDG_DATA_HOME, "");

  if (!is_absolute_path(path)) {
    path = env::get(HOME) + XDG_DATA_HOME_SUFFIX;
  }

  if (!is_absolute_path(path))
    path = {};

  return path;
}